

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::TrackInstrsForScopeObjectRemoval(GlobOpt *this,Instr *instr)

{
  Opnd *pOVar1;
  Opnd *this_00;
  Func *func;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  ushort uVar5;
  int iVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *pJVar8;
  StackSym *pSVar9;
  undefined4 extraout_var;
  AddrOpnd *src1Opnd;
  RegOpnd *pRVar10;
  Instr *pIVar11;
  Instr *pIVar12;
  Func *pFVar13;
  short sVar14;
  uint uVar15;
  int iVar16;
  StackSym *local_40;
  
  pOVar1 = instr->m_dst;
  if (instr->m_opcode == Ld_A) {
    this_00 = instr->m_src1;
    bVar3 = IR::Opnd::IsRegOpnd(this_00);
    if (((bVar3) && (bVar3 = Func::IsStackArgsEnabled(instr->m_func), bVar3)) &&
       (bVar3 = IR::Opnd::IsScopeObjOpnd(this_00,instr->m_func), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x57f,
                         "(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func))"
                         ,"There can be no aliasing for scope object.");
      if (!bVar3) goto LAB_0042061b;
      *puVar7 = 0;
    }
  }
  bVar3 = Func::IsStackArgsEnabled(instr->m_func);
  if ((bVar3) && (this->prePassLoop == (Loop *)0x0)) {
    if (instr->m_opcode != InlineeStart) {
      if (instr->m_opcode != LdSlotArr) {
        return;
      }
      bVar3 = IR::Opnd::IsScopeObjOpnd(instr->m_src1,instr->m_func);
      if (!bVar3) {
        return;
      }
      pJVar8 = Func::GetJITFunctionBody(instr->m_func);
      bVar3 = JITTimeFunctionBody::HasImplicitArgIns(pJVar8);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x589,"(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns())",
                           "No mapping is required in this case. So it should already be generating ArgIns."
                          );
        if (!bVar3) goto LAB_0042061b;
        *puVar7 = 0;
      }
      pFVar13 = instr->m_func;
      pSVar9 = IR::Opnd::GetStackSym(pOVar1);
      Func::TrackFormalsArraySym(pFVar13,(pSVar9->super_Sym).m_id);
      return;
    }
    pFVar13 = instr->m_func;
    if (pFVar13->parentFunc == (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x58f,"(instr->m_func->IsInlined())","instr->m_func->IsInlined()");
      if (!bVar3) goto LAB_0042061b;
      *puVar7 = 0;
      pFVar13 = instr->m_func;
    }
    iVar6 = *(int *)&pFVar13->actualCount;
    pJVar8 = Func::GetJITFunctionBody(pFVar13);
    AVar4 = JITTimeFunctionBody::GetInParamsCount(pJVar8);
    pFVar13 = instr->m_func;
    func = pFVar13->parentFunc;
    pSVar9 = IR::Opnd::GetStackSym(instr->m_src2);
    if ((pSVar9->field_0x18 & 1) == 0) {
      pIVar12 = (Instr *)0x0;
    }
    else {
      pIVar12 = (pSVar9->field_5).m_instrDef;
    }
    if ((instr->m_func->field_0x241 & 0x40) != 0) {
      pSVar9 = IR::Opnd::GetStackSym(pIVar12->m_src1);
      if (((pSVar9->field_0x18 & 1) != 0) && ((pSVar9->field_5).m_instrDef != (Instr *)0x0)) {
        pSVar9 = IR::Opnd::GetStackSym(pIVar12->m_src1);
        if ((pSVar9->field_0x18 & 1) == 0) {
          pIVar11 = (Instr *)0x0;
        }
        else {
          pIVar11 = (pSVar9->field_5).m_instrDef;
        }
        if (pIVar11->m_opcode != NewScObjectNoCtor) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x59e,
                             "(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                             ,
                             "argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor"
                            );
          if (!bVar3) {
LAB_0042061b:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
      }
      pSVar9 = IR::Opnd::GetStackSym(pIVar12->m_src2);
      if ((pSVar9->field_0x18 & 1) == 0) {
        pIVar12 = (Instr *)0x0;
      }
      else {
        pIVar12 = (pSVar9->field_5).m_instrDef;
      }
    }
    uVar5 = (short)iVar6 - 1;
    iVar16 = AVar4 - 1;
    if ((ushort)iVar16 < uVar5) {
      uVar15 = iVar6 - (uint)AVar4;
      while (sVar14 = (short)uVar15, uVar15 = (uint)(ushort)(sVar14 - 1), sVar14 != 0) {
        pSVar9 = IR::Opnd::GetStackSym(pIVar12->m_src2);
        if ((pSVar9->field_0x18 & 1) == 0) {
          pIVar12 = (Instr *)0x0;
        }
        else {
          pIVar12 = (pSVar9->field_5).m_instrDef;
        }
      }
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_40 = (StackSym *)0x0;
    while ((ushort)iVar16 != 0) {
      if (pIVar12->m_src1 == (Opnd *)0x0) {
        pSVar9 = (StackSym *)0x0;
      }
      else {
        bVar3 = IR::Opnd::IsRegOpnd(pIVar12->m_src1);
        if (bVar3) {
          pSVar9 = IR::Opnd::GetStackSym(pIVar12->m_src1);
        }
        else {
          pSVar9 = StackSym::New(func);
          pOVar1 = pIVar12->m_src1;
          pRVar10 = IR::RegOpnd::New(pSVar9,TyVar,func);
          pIVar11 = IR::Instr::New(Ld_A,&pRVar10->super_Opnd,pOVar1,func);
          IR::Instr::InsertBefore(instr,pIVar11);
        }
      }
      iVar6 = iVar16 + -1;
      bVar3 = Func::HasStackSymForFormal(pFVar13,(ArgSlot)iVar6);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x5c3,"(!func->HasStackSymForFormal(param - 1))",
                           "!func->HasStackSymForFormal(param - 1)");
        if (!bVar3) goto LAB_0042061b;
        *puVar7 = 0;
      }
      if (uVar5 < (ushort)iVar16) {
        if (local_40 == (StackSym *)0x0) {
          local_40 = StackSym::New(func);
          iVar6 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
          src1Opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar6),AddrOpndKindDynamicMisc,func,
                                       false,(Var)0x0);
          pRVar10 = IR::RegOpnd::New(local_40,TyVar,func);
          pIVar11 = IR::Instr::New(Ld_A,&pRVar10->super_Opnd,&src1Opnd->super_Opnd,func);
          IR::Instr::InsertBefore(instr,pIVar11);
        }
        Func::TrackStackSymForFormalIndex(pFVar13,(ArgSlot)(iVar16 + -1),local_40);
        iVar16 = iVar16 + -1;
      }
      else {
        if (pSVar9 == (StackSym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x5c7,"(argOutSym)","argOutSym");
          if (!bVar3) goto LAB_0042061b;
          *puVar7 = 0;
        }
        Func::TrackStackSymForFormalIndex(pFVar13,(ArgSlot)iVar6,pSVar9);
        pSVar9 = IR::Opnd::GetStackSym(pIVar12->m_src2);
        iVar16 = iVar6;
        if ((pSVar9->field_0x18 & 1) == 0) {
          pIVar12 = (Instr *)0x0;
        }
        else {
          pIVar12 = (pSVar9->field_5).m_instrDef;
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackInstrsForScopeObjectRemoval(IR::Instr * instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();

    if (instr->m_opcode == Js::OpCode::Ld_A && src1->IsRegOpnd())
    {
        AssertMsg(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func), "There can be no aliasing for scope object.");
    }

    // The following is to track formals array for Stack Arguments optimization with Formals
    if (instr->m_func->IsStackArgsEnabled() && !this->IsLoopPrePass())
    {
        if (instr->m_opcode == Js::OpCode::LdSlotArr)
        {
            if (instr->GetSrc1()->IsScopeObjOpnd(instr->m_func))
            {
                AssertMsg(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns(), "No mapping is required in this case. So it should already be generating ArgIns.");
                instr->m_func->TrackFormalsArraySym(dst->GetStackSym()->m_id);
            }
        }
        else if (instr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(instr->m_func->IsInlined());
            Js::ArgSlot actualsCount = instr->m_func->actualCount - 1;
            Js::ArgSlot formalsCount = instr->m_func->GetJITFunctionBody()->GetInParamsCount() - 1;

            Func * func = instr->m_func;
            Func * inlinerFunc = func->GetParentFunc(); //Inliner's func

            IR::Instr * argOutInstr = instr->GetSrc2()->GetStackSym()->GetInstrDef();

            //The argout immediately before the InlineeStart will be the ArgOut for NewScObject
            //So we don't want to track the stack sym for this argout.- Skipping it here.
            if (instr->m_func->IsInlinedConstructor())
            {
                //PRE might introduce a second defintion for the Src1. So assert for the opcode only when it has single definition.
                Assert(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr ||
                    argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor);
                argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
            }
            if (formalsCount < actualsCount)
            {
                Js::ArgSlot extraActuals = actualsCount - formalsCount;

                //Skipping extra actuals passed
                for (Js::ArgSlot i = 0; i < extraActuals; i++)
                {
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
            }

            StackSym * undefinedSym = nullptr;

            for (Js::ArgSlot param = formalsCount; param > 0; param--)
            {
                StackSym * argOutSym = nullptr;

                if (argOutInstr->GetSrc1())
                {
                    if (argOutInstr->GetSrc1()->IsRegOpnd())
                    {
                        argOutSym = argOutInstr->GetSrc1()->GetStackSym();
                    }
                    else
                    {
                        // We will always have ArgOut instr - so the source operand will not be removed.
                        argOutSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = argOutInstr->GetSrc1();
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(argOutSym, TyVar, inlinerFunc);
                        IR::Instr * assignInstr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignInstr);
                    }
                }

                Assert(!func->HasStackSymForFormal(param - 1));

                if (param <= actualsCount)
                {
                    Assert(argOutSym);
                    func->TrackStackSymForFormalIndex(param - 1, argOutSym);
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
                else
                {
                    /*When param is out of range of actuals count, load undefined*/
                    // TODO: saravind: This will insert undefined for each of the param not having an actual. - Clean up this by having a sym for undefined on func ?
                    Assert(formalsCount > actualsCount);
                    if (undefinedSym == nullptr)
                    {
                        undefinedSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = IR::AddrOpnd::New(inlinerFunc->GetScriptContextInfo()->GetUndefinedAddr(), IR::AddrOpndKindDynamicMisc, inlinerFunc);
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(undefinedSym, TyVar, inlinerFunc);
                        IR::Instr * assignUndefined = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignUndefined);
                    }
                    func->TrackStackSymForFormalIndex(param - 1, undefinedSym);
                }
            }
        }
    }
}